

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O3

void __thiscall WSNTopologyBasedEnergy::DrawWSNLayer(WSNTopologyBasedEnergy *this)

{
  long *local_78;
  undefined8 uStack_70;
  long local_68 [2];
  _InputArray local_58;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  local_58.sz.width = 0;
  local_58.sz.height = 0;
  local_58.flags = 0x3010000;
  local_20 = 0;
  local_78 = (long *)0x406fe00000000000;
  uStack_70 = 0;
  local_68[0] = 0x406fe00000000000;
  local_68[1] = 0;
  local_58.obj = this;
  cv::circle(&local_58,&local_20,1,&local_78,1,8,0);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"WSN","");
  local_58.sz.width = 0;
  local_58.sz.height = 0;
  local_58.flags = 0x1010000;
  local_58.obj = this;
  cv::imshow((string *)&local_78,&local_58);
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (this->Test == true) {
    cv::waitKey(200);
  }
  local_58.sz.width = 0;
  local_58.sz.height = 0;
  local_58.flags = 0x3010000;
  local_28 = 0;
  local_78 = (long *)0x406fe00000000000;
  uStack_70 = 0;
  local_68[0] = 0x406fe00000000000;
  local_68[1] = 0;
  local_58.obj = this;
  cv::circle(&local_58,&local_28,0x12f,&local_78,1,8,0);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"WSN","");
  local_58.sz.width = 0;
  local_58.sz.height = 0;
  local_58.flags = 0x1010000;
  local_58.obj = this;
  cv::imshow((string *)&local_78,&local_58);
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (this->Test == true) {
    cv::waitKey(200);
  }
  local_58.sz.width = 0;
  local_58.sz.height = 0;
  local_58.flags = 0x3010000;
  local_30 = 0;
  local_78 = (long *)0x406fe00000000000;
  uStack_70 = 0;
  local_68[0] = 0x406fe00000000000;
  local_68[1] = 0;
  local_58.obj = this;
  cv::circle(&local_58,&local_30,0x1ac,&local_78,1,8,0);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"WSN","");
  local_58.sz.width = 0;
  local_58.sz.height = 0;
  local_58.flags = 0x1010000;
  local_58.obj = this;
  cv::imshow((string *)&local_78,&local_58);
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (this->Test == true) {
    cv::waitKey(200);
  }
  local_58.sz.width = 0;
  local_58.sz.height = 0;
  local_58.flags = 0x3010000;
  local_38 = 0;
  local_78 = (long *)0x406fe00000000000;
  uStack_70 = 0;
  local_68[0] = 0x406fe00000000000;
  local_68[1] = 0;
  local_58.obj = this;
  cv::circle(&local_58,&local_38,0x20c,&local_78,1,8,0);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"WSN","");
  local_58.sz.width = 0;
  local_58.sz.height = 0;
  local_58.flags = 0x1010000;
  local_58.obj = this;
  cv::imshow((string *)&local_78,&local_58);
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (this->Test == true) {
    cv::waitKey(200);
  }
  local_58.sz.width = 0;
  local_58.sz.height = 0;
  local_58.flags = 0x3010000;
  local_40 = 0;
  local_78 = (long *)0x406fe00000000000;
  uStack_70 = 0;
  local_68[0] = 0x406fe00000000000;
  local_68[1] = 0;
  local_58.obj = this;
  cv::circle(&local_58,&local_40,0x260,&local_78,1,8,0);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"WSN","");
  local_58.sz.width = 0;
  local_58.sz.height = 0;
  local_58.flags = 0x1010000;
  local_58.obj = this;
  cv::imshow((string *)&local_78,&local_58);
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (this->Test == true) {
    cv::waitKey(0);
  }
  return;
}

Assistant:

void WSNTopologyBasedEnergy::DrawWSNLayer()
{
	circle(img,Point(0,0),1,Scalar(255,0,255));
	imshow("WSN",img);
	if(true==Test) waitKey(200);

	circle(img,Point(0,0),303,Scalar(255,0,255));
	imshow("WSN",img);
	if(true==Test) waitKey(200);

	circle(img,Point(0,0),428,Scalar(255,0,255));
	imshow("WSN",img);
	if(true==Test) waitKey(200);

	circle(img,Point(0,0),524,Scalar(255,0,255));
	imshow("WSN",img);
	if(true==Test) waitKey(200);

	circle(img,Point(0,0),608,Scalar(255,0,255));
	imshow("WSN",img);
	if(true==Test) waitKey();
}